

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixStep4
               (double *f0_step3,int f0_length,double **f0_candidates,int number_of_candidates,
               double allowed_range,int *positive_index,int positive_count,double *f0_step4)

{
  int in_ECX;
  double **in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar1;
  int j;
  int i_1;
  int limit;
  int i;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  
  for (local_38 = 0; local_38 < in_ESI; local_38 = local_38 + 1) {
    *(undefined8 *)(_i_1 + (long)local_38 * 8) = *(undefined8 *)(in_RDI + (long)local_38 * 8);
  }
  local_40 = in_R9D + -1;
  do {
    if (local_40 < 0) {
      return;
    }
    if (local_40 == 0) {
      local_48 = 1;
    }
    else {
      local_48 = *(int *)(in_R8 + (long)(local_40 + -1) * 4);
    }
    for (local_44 = *(int *)(in_R8 + (long)local_40 * 4); local_48 < local_44;
        local_44 = local_44 + -1) {
      dVar1 = SelectBestF0(*(double *)(_i_1 + (long)local_44 * 8),
                           *(double *)(_i_1 + (long)(local_44 + 1) * 8),in_RDX,in_ECX,local_44 + -1,
                           in_XMM0_Qa);
      *(double *)(_i_1 + (long)(local_44 + -1) * 8) = dVar1;
      dVar1 = *(double *)(_i_1 + (long)(local_44 + -1) * 8);
      if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
    }
    local_40 = local_40 + -1;
  } while( true );
}

Assistant:

static void FixStep4(const double *f0_step3, int f0_length,
    const double * const * f0_candidates, int number_of_candidates,
    double allowed_range, const int *positive_index, int positive_count,
    double *f0_step4) {
  for (int i = 0; i < f0_length; ++i) f0_step4[i] = f0_step3[i];

  int limit;
  for (int i = positive_count - 1; i >= 0; --i) {
    limit = i == 0 ? 1 : positive_index[i - 1];
    for (int j = positive_index[i]; j > limit; --j) {
      f0_step4[j - 1] =
        SelectBestF0(f0_step4[j], f0_step4[j + 1], f0_candidates,
            number_of_candidates, j - 1, allowed_range);
      if (f0_step4[j - 1] == 0) break;
    }
  }
}